

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O1

size_t __thiscall DObject::PropagateMark(DObject *this)

{
  PClass *this_00;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  size_t *psVar3;
  
  if (this->Class == (PClass *)0x0) {
    iVar1 = (**this->_vptr_DObject)(this);
    this->Class = (PClass *)CONCAT44(extraout_var,iVar1);
  }
  if (PClass::bShutdown == false) {
    this_00 = this->Class;
    psVar3 = this_00->FlatPointers;
    if (psVar3 == (size_t *)0x0) {
      PClass::BuildFlatPointers(this_00);
      psVar3 = this_00->FlatPointers;
    }
    sVar2 = *psVar3;
    while (sVar2 != 0xffffffffffffffff) {
      psVar3 = psVar3 + 1;
      GC::Mark((DObject **)((long)&this->_vptr_DObject + sVar2));
      sVar2 = *psVar3;
    }
    sVar2 = (size_t)*(uint *)&(this_00->super_PNativeStruct).super_PStruct.super_PNamedType.
                              super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
                              field_0x24;
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t DObject::PropagateMark()
{
	const PClass *info = GetClass();
	if (!PClass::bShutdown)
	{
		const size_t *offsets = info->FlatPointers;
		if (offsets == NULL)
		{
			const_cast<PClass *>(info)->BuildFlatPointers();
			offsets = info->FlatPointers;
		}
		while (*offsets != ~(size_t)0)
		{
			GC::Mark((DObject **)((BYTE *)this + *offsets));
			offsets++;
		}
		return info->Size;
	}
	return 0;
}